

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ScopeData * __thiscall
ExpressionContext::GlobalScopeFrom(ExpressionContext *this,ScopeData *scopeData)

{
  ScopeData *pSVar1;
  
  while ((((scopeData != (ScopeData *)0x0 &&
           (pSVar1 = scopeData, scopeData->type != SCOPE_TEMPORARY)) &&
          (scopeData->ownerFunction == (FunctionData *)0x0)) &&
         (scopeData->ownerType == (TypeBase *)0x0))) {
    scopeData = scopeData->scope;
    if (scopeData == (ScopeData *)0x0) {
      return pSVar1;
    }
  }
  return (ScopeData *)0x0;
}

Assistant:

ScopeData* ExpressionContext::GlobalScopeFrom(ScopeData *scopeData)
{
	if(!scopeData)
		return NULL;

	if(scopeData->type == SCOPE_TEMPORARY)
		return NULL;

	if(scopeData->ownerFunction)
		return NULL;

	if(scopeData->ownerType)
		return NULL;

	if(scopeData->scope)
		return GlobalScopeFrom(scopeData->scope);

	return scopeData;
}